

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# spectral.hpp
# Opt level: O3

spectral_operation __thiscall kitty::detail::spectrum::disjoint_translation(spectrum *this,int i)

{
  int iVar1;
  pointer piVar2;
  spectral_operation sVar3;
  long lVar4;
  ulong uVar5;
  uint uVar6;
  
  piVar2 = (this->_s).super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
           _M_start;
  lVar4 = (long)(this->_s).super__Vector_base<int,_std::allocator<int>_>._M_impl.
                super__Vector_impl_data._M_finish - (long)piVar2;
  if (lVar4 != 0) {
    uVar5 = 0;
    do {
      if (((uint)uVar5 & i) != 0) {
        uVar6 = (uint)uVar5 - i;
        iVar1 = piVar2[uVar5];
        piVar2[uVar5] = piVar2[uVar6];
        piVar2[uVar6] = iVar1;
      }
      uVar5 = uVar5 + 1;
    } while ((uVar5 & 0xffffffff) < (ulong)(lVar4 >> 2));
  }
  sVar3._0_4_ = i << 0x10 | 5;
  sVar3._var2 = 0;
  return sVar3;
}

Assistant:

auto disjoint_translation( int i )
  {
    spectral_operation op( spectral_operation::kind::disjoint_translation, i );

    for ( auto k = 0u; k < _s.size(); ++k )
    {
      if ( ( k & i ) > 0 )
      {
        std::swap( _s[k], _s[k - i] );
      }
    }

    return op;
  }